

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void Init_ADPCMATable(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  piVar3 = jedi_table;
  for (lVar5 = 0; lVar5 != 0x31; lVar5 = lVar5 + 1) {
    iVar1 = steps[lVar5];
    uVar6 = 0;
    for (uVar7 = 0; uVar7 != 0x10; uVar7 = uVar7 + 1) {
      iVar2 = (int)(((uVar6 & 0xe) + 1) * iVar1) / 8;
      iVar4 = -iVar2;
      if (uVar7 < 8) {
        iVar4 = iVar2;
      }
      piVar3[uVar7] = iVar4;
      uVar6 = uVar6 + 2;
    }
    piVar3 = piVar3 + 0x10;
  }
  return;
}

Assistant:

static void Init_ADPCMATable(void)
{
	int step, nib;

	for (step = 0; step < 49; step++)
	{
		/* loop over all nibbles and compute the difference */
		for (nib = 0; nib < 16; nib++)
		{
			int value = (2*(nib & 0x07) + 1) * steps[step] / 8;
			jedi_table[step*16 + nib] = (nib&0x08) ? -value : value;
		}
	}
}